

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O1

void __thiscall MeshLib::Solid::removeDanglingVertices(Solid *this)

{
  Tree<MeshLib::Vertex> *tree;
  int *piVar1;
  Vertex *inData;
  pointer pcVar2;
  Node<MeshLib::Vertex> *pNVar3;
  ListNode<MeshLib::Vertex> *pLVar4;
  List<MeshLib::Vertex> dangling_verts;
  TreeIterator<MeshLib::Vertex> viter;
  List<MeshLib::Vertex> local_148;
  TreeIterator<MeshLib::Vertex> local_138;
  
  local_148.m_head = (ListNode<MeshLib::Vertex> *)0x0;
  local_148.m_size = 0;
  tree = &this->m_verts;
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator(&local_138,tree);
  pLVar4 = local_148.m_head;
  if (local_138.m_finished == false) {
    do {
      if ((local_138.m_pointer)->data->m_halfedge == (HalfEdge *)0x0) {
        List<MeshLib::Vertex>::Append(&local_148,(local_138.m_pointer)->data);
      }
      AVL::TreeIterator<MeshLib::Vertex>::operator++(&local_138);
      pLVar4 = local_148.m_head;
    } while (local_138.m_finished == false);
  }
  for (; pLVar4 != (ListNode<MeshLib::Vertex> *)0x0; pLVar4 = pLVar4->m_next) {
    inData = pLVar4->m_data;
    pNVar3 = AVL::Node<MeshLib::Vertex>::remove_node(tree->root,inData);
    tree->root = pNVar3;
    if (pNVar3 != (Node<MeshLib::Vertex> *)0x0) {
      piVar1 = &(this->m_verts).size;
      *piVar1 = *piVar1 + -1;
    }
    if (inData != (Vertex *)0x0) {
      pcVar2 = (inData->m_string)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &(inData->m_string).field_2) {
        operator_delete(pcVar2);
      }
      operator_delete(inData);
    }
  }
  List<MeshLib::Vertex>::~List(&local_148);
  return;
}

Assistant:

void 
Solid::removeDanglingVertices()
{
	List<Vertex> dangling_verts;
	//Label boundary edges
	for( AVL::TreeIterator<Vertex> viter( m_verts ); ! viter.end() ; ++ viter )
	{
		Solid::tVertex     v = *viter;
		if( v->halfedge() != NULL ) continue;
		dangling_verts.Append( v );
	}

	for( ListIterator<Vertex> iter( dangling_verts ); !iter.end(); ++ iter )
	{
		Solid::tVertex v = *iter;
		m_verts.remove( v );
		delete v;
		v = NULL;
	}
}